

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::process_expired_timers<timertt::details::thread_unsafe_manager_mixin::lock_guard>
          (timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this,lock_guard *lock)

{
  bool bVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point now;
  lock_guard *lock_local;
  timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  
  now.__d.__r = (duration)(duration)lock;
  local_20.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  while( true ) {
    if ((this->m_current_tick_processed & 1U) == 0) {
      process_current_wheel_position<timertt::details::thread_unsafe_manager_mixin::lock_guard>
                (this,(lock_guard *)now.__d.__r);
      this->m_current_position = this->m_current_position + 1;
      if (this->m_wheel_size <= this->m_current_position) {
        this->m_current_position = 0;
      }
      this->m_current_tick_processed = true;
    }
    bVar1 = std::chrono::operator>=(&local_20,&this->m_current_tick_border);
    if (!bVar1) break;
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::operator+=(&this->m_current_tick_border,&this->m_granularity);
    this->m_current_tick_processed = false;
  }
  return;
}

Assistant:

void
	process_expired_timers(
		//! Object's lock.
		UNIQUE_LOCK & lock )
	{
		/*
		 * NOTE: It is possible that period between consequtive
		 * calls to process_expired_timers will be longer than
		 * m_granuality (it is possible when engine is used inside
		 * timer_manager). In that case it is necessary to process
		 * several wheel positions at once.
		 */
		const auto now = monotonic_clock::now();
		for(;;)
		{
			if( !m_current_tick_processed )
			{
				process_current_wheel_position( lock );

				// After processing all current demands and rescheduling
				// all periodic demands the current_position must be
				// advanced.
				m_current_position += 1;
				if( m_current_position >= m_wheel_size )
					m_current_position = 0;

				m_current_tick_processed = true;
			}

			if( now >= m_current_tick_border )
			{
				// A switch to next tick is necessary.
				m_current_tick_border += m_granularity;
				m_current_tick_processed = false;
			}
			else
				break;
		}
	}